

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

string * __thiscall
tonk::JsonValue<char_const*>(string *__return_storage_ptr__,tonk *this,char *value)

{
  string *value_00;
  allocator local_31;
  string local_30 [32];
  
  if (this == (tonk *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_31);
  }
  else {
    std::__cxx11::string::string(local_30,(char *)this,&local_31);
    JsonValue<std::__cxx11::string>(__return_storage_ptr__,(tonk *)local_30,value_00);
    std::__cxx11::string::~string(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string JsonValue(const char* value) {
    if (value == nullptr)
        return "null";
    return JsonValue(static_cast<std::string>(value));
}